

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O2

void __thiscall
ProtocolTCP::Reset(ProtocolTCP *this,InterfaceMAC *mac,uint16_t localPort,uint16_t remotePort,
                  uint8_t *remoteAddress)

{
  undefined2 uVar1;
  ProtocolIPv4 *this_00;
  uint16_t value;
  DataBuffer *buffer;
  uint8_t *sourceIP;
  uint8_t *puVar2;
  
  buffer = ProtocolIPv4::GetTxBuffer(this->IP,mac);
  if (buffer != (DataBuffer *)0x0) {
    puVar2 = buffer->Packet;
    buffer->Remainder = buffer->Remainder - 0x14;
    Pack16(puVar2,0,localPort);
    Pack16(puVar2,2,remotePort);
    Pack32(puVar2,4,0);
    Pack32(puVar2,8,0);
    Pack8(puVar2,0xc,'P');
    Pack8(puVar2,0xd,'\x04');
    Pack16(puVar2,0xe,0);
    Pack16(puVar2,0x10,0);
    Pack16(puVar2,0x12,0);
    sourceIP = ProtocolIPv4::GetUnicastAddress(this->IP);
    value = ComputeChecksum(puVar2,0x14,sourceIP,remoteAddress);
    Pack16(puVar2,0x10,value);
    uVar1 = buffer->Length;
    buffer->Length = uVar1 + 0x14;
    buffer->Remainder = buffer->Remainder - (uVar1 + 0x14);
    this_00 = this->IP;
    puVar2 = ProtocolIPv4::GetUnicastAddress(this_00);
    ProtocolIPv4::Transmit(this_00,buffer,'\x06',remoteAddress,puVar2);
    return;
  }
  return;
}

Assistant:

void ProtocolTCP::Reset(InterfaceMAC* mac,
                        uint16_t localPort,
                        uint16_t remotePort,
                        const uint8_t* remoteAddress)
{
    uint8_t* packet;
    uint16_t checksum;
    uint16_t length;

    DataBuffer* buffer = IP.GetTxBuffer(mac);

    if (buffer == nullptr)
    {
        return;
    }

    buffer->Packet += header_size();
    buffer->Remainder -= header_size();

    buffer->Packet -= header_size();
    packet = buffer->Packet;
    length = buffer->Length;
    if (packet != nullptr)
    {
        Pack16(packet, 0, localPort);
        Pack16(packet, 2, remotePort);
        Pack32(packet, 4, 0);    // Sequence
        Pack32(packet, 8, 0);    // AckSequence
        Pack8(packet, 12, 0x50); // Header length and reserved
        Pack8(packet, 13, FLAG_RST);
        Pack16(packet, 14, 0); // window size
        Pack16(packet, 16, 0); // clear checksum
        Pack16(packet, 18, 0); // 2 bytes of UrgentPointer

        checksum = ProtocolTCP::ComputeChecksum(
            packet, header_size(), IP.GetUnicastAddress(), remoteAddress);

        Pack16(packet, 16, checksum); // checksum

        buffer->Length += header_size();
        buffer->Remainder -= buffer->Length;

        IP.Transmit(buffer, 0x06, remoteAddress, IP.GetUnicastAddress());
    }
}